

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

pop_result_t __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t::pop
          (event_queue_impl_t *this,execution_demand_t *receiver)

{
  bool bVar1;
  reference pvVar2;
  execution_demand_t *receiver_local;
  event_queue_impl_t *this_local;
  
  bVar1 = std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::empty
                    (&this->m_demands);
  if (!bVar1) {
    pvVar2 = std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::front
                       (&this->m_demands);
    execution_demand_t::operator=(receiver,pvVar2);
    std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::pop_front
              (&this->m_demands);
  }
  this_local._4_4_ = (pop_result_t)bVar1;
  return this_local._4_4_;
}

Assistant:

pop_result_t
		pop( execution_demand_t & receiver ) SO_5_NOEXCEPT
			{
				if( !m_demands.empty() )
					{
						receiver = std::move(m_demands.front());
						m_demands.pop_front();
						return pop_result_t::extracted;
					}

				return pop_result_t::empty_queue;
			}